

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<QSharedPointer<int>>
          (PromiseError *this,QSharedPointer<int> *value)

{
  QSharedPointer<int> *this_00;
  QSharedPointer<int> *value_local;
  PromiseError *this_local;
  
  std::__exception_ptr::exception_ptr::exception_ptr(&this->m_data);
  this_00 = (QSharedPointer<int> *)__cxa_allocate_exception(0x10);
  QSharedPointer<int>::QSharedPointer(this_00,value);
  __cxa_throw(this_00,&QSharedPointer<int>::typeinfo,QSharedPointer<int>::~QSharedPointer);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }